

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O2

QString * qulltoa(QString *__return_storage_ptr__,qulonglong number,int base,QStringView zero)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  short sVar5;
  ushort uVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  char16_t cVar10;
  uint uVar11;
  QChar *pQVar12;
  char16_t cVar13;
  long in_FS_OFFSET;
  QStringView local_148;
  QStringView zero_local;
  char16_t buff [128];
  long local_28;
  
  zero_local.m_size = zero.m_size;
  zero_local.m_data = zero.m_data;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = (QChar *)&local_28;
  if (base == 10) {
    local_148.m_data = L"0";
    local_148.m_size = 1;
    bVar7 = comparesEqual(&zero_local,&local_148);
    if (!bVar7) {
      cVar13 = *zero_local.m_data;
      if ((cVar13 & 0xf800U) == 0xd800 || zero_local.m_size == 0) {
        uVar8 = (uint)(ushort)cVar13 * 0x400 + (uint)(ushort)zero_local.m_data[1] + 0xfca02400;
        while (number != 0) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = number;
          number = number / 10;
          uVar11 = uVar8;
          if (SUB168(auVar3 % ZEXT816(10),0) != 0) {
            uVar11 = SUB164(auVar3 % ZEXT816(10),0);
            if (uVar8 == 0x3007) {
              uVar11 = uVar11 | 0x3020;
            }
            else {
              uVar11 = uVar11 + uVar8;
            }
          }
          pQVar12[-1].ucs = (ushort)uVar11 & 0x3ff | 0xdc00;
          pQVar12[-2].ucs = (short)(uVar11 >> 10) + L'ퟀ';
          pQVar12 = pQVar12 + -2;
        }
      }
      else {
        while (number != 0) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = number;
          number = number / 10;
          cVar10 = cVar13;
          if (SUB168(auVar4 % ZEXT816(10),0) != 0) {
            uVar6 = SUB162(auVar4 % ZEXT816(10),0);
            if (cVar13 == L'〇') {
              cVar10 = uVar6 | 0x3020;
            }
            else {
              cVar10 = uVar6 + cVar13;
            }
          }
          pQVar12[-1].ucs = cVar10;
          pQVar12 = pQVar12 + -1;
        }
      }
      goto LAB_0011e06d;
    }
  }
  uVar9 = (ulong)base;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar9;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = number;
    sVar5 = SUB162(auVar2 % auVar1,0);
    cVar13 = sVar5 + L'0';
    if (9 < SUB164(auVar2 % auVar1,0)) {
      cVar13 = sVar5 + L'W';
    }
    pQVar12[-1].ucs = cVar13;
    pQVar12 = pQVar12 + -1;
    bVar7 = uVar9 <= number;
    number = number / uVar9;
  } while (bVar7);
LAB_0011e06d:
  QString::QString(__return_storage_ptr__,pQVar12,(long)&local_28 - (long)pQVar12 >> 1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString qulltoa(qulonglong number, int base, const QStringView zero)
{
    // Length of MAX_ULLONG in base 2 is 64; and we may need a surrogate pair
    // per digit. We do not need a terminator.
    const unsigned maxlen = 128;
    static_assert(CHAR_BIT * sizeof(number) <= maxlen);
    Q_DECL_UNINITIALIZED char16_t buff[maxlen];
    char16_t *const end = buff + maxlen, *p = end;

    if (base != 10 || zero == u"0") {
        qulltoString_helper<char16_t>(number, base, p);
    } else if (zero.size() && !zero.at(0).isSurrogate()) {
        const char16_t zeroUcs2 = zero.at(0).unicode();
        while (number != 0) {
            *(--p) = unicodeForDigit(number % base, zeroUcs2);

            number /= base;
        }
    } else if (zero.size() == 2 && zero.at(0).isHighSurrogate()) {
        const char32_t zeroUcs4 = QChar::surrogateToUcs4(zero.at(0), zero.at(1));
        while (number != 0) {
            const char32_t digit = unicodeForDigit(number % base, zeroUcs4);

            *(--p) = QChar::lowSurrogate(digit);
            *(--p) = QChar::highSurrogate(digit);

            number /= base;
        }
    } else { // zero should always be either a non-surrogate or a surrogate pair:
        Q_UNREACHABLE_RETURN(QString());
    }

    return QString(reinterpret_cast<QChar *>(p), end - p);
}